

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O1

FeatureType * __thiscall
CoreML::Specification::FeatureDescription::mutable_type(FeatureDescription *this)

{
  ulong uVar1;
  FeatureType *pFVar2;
  Arena *arena;
  
  if (this->type_ == (FeatureType *)0x0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pFVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>(arena);
    this->type_ = pFVar2;
  }
  return this->type_;
}

Assistant:

inline ::CoreML::Specification::FeatureType* FeatureDescription::mutable_type() {
  ::CoreML::Specification::FeatureType* _msg = _internal_mutable_type();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureDescription.type)
  return _msg;
}